

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::SourceArrayLoader::begin__param
          (SourceArrayLoader *this,param__AttributeData *attributeData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_type sVar4;
  AccessorParameter accessorParameter;
  value_type local_70;
  
  if (this->mCurrentSoure != (SourceBase *)0x0) {
    paVar1 = &local_70.name.field_2;
    local_70.name._M_string_length = 0;
    local_70.name.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_70.type.field_2;
    local_70.type._M_string_length = 0;
    local_70.type.field_2._M_local_buf[0] = '\0';
    pcVar3 = attributeData->name;
    local_70.name._M_dataplus._M_p = (pointer)paVar1;
    local_70.type._M_dataplus._M_p = (pointer)paVar2;
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar3);
    }
    sVar4 = local_70.type._M_string_length;
    pcVar3 = attributeData->type;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_70.type,0,(char *)sVar4,(ulong)pcVar3);
    std::
    vector<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
    ::push_back(&this->mCurrentSoure->mAccessor,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.type._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.type._M_dataplus._M_p,
                      CONCAT71(local_70.type.field_2._M_allocated_capacity._1_7_,
                               local_70.type.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.name._M_dataplus._M_p,
                      CONCAT71(local_70.name.field_2._M_allocated_capacity._1_7_,
                               local_70.name.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool SourceArrayLoader::begin__param( const param__AttributeData& attributeData )
	{
		if ( mCurrentSoure )
		{
			SourceBase::AccessorParameter accessorParameter;
			if ( attributeData.name && *attributeData.name )
			{
				accessorParameter.name = attributeData.name;
			}

			// the type is required. We don't need to check
			accessorParameter.type = attributeData.type;
			mCurrentSoure->appendAccessorParameter( accessorParameter );
		}
		return true;
	}